

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O0

char * __thiscall cmCommand::GetError(cmCommand *this)

{
  ulong uVar1;
  char *pcVar2;
  string local_30 [32];
  cmCommand *local_10;
  cmCommand *this_local;
  
  local_10 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    (*(this->super_cmObject)._vptr_cmObject[0xc])(local_30);
    std::__cxx11::string::operator=((string *)&this->Error,local_30);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::operator+=((string *)&this->Error," unknown error.");
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

const char* GetError()
    {
      if(this->Error.empty())
        {
        this->Error = this->GetName();
        this->Error += " unknown error.";
        }
      return this->Error.c_str();
    }